

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void store_stock_list(store *store,object **list,wchar_t n)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  _Bool _Var4;
  ulong uVar5;
  ulong uVar6;
  object *orig;
  ulong uVar7;
  object *new;
  
  uVar3 = store_home_idx;
  if (L'\0' < n) {
    uVar1 = store->sidx;
    uVar5 = 0;
    uVar7 = 0;
    do {
      new = store->stock;
      if (new == (object *)0x0) {
        orig = (object *)0x0;
      }
      else {
        orig = (object *)0x0;
        do {
          if ((int)uVar7 == 0) {
LAB_001cf631:
            _Var4 = earlier_object(orig,new,uVar1 != uVar3);
            if (_Var4) {
              orig = new;
            }
          }
          else {
            bVar2 = true;
            uVar6 = 0;
            do {
              bVar2 = (bool)(bVar2 & list[uVar6] != new);
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
            if (bVar2) goto LAB_001cf631;
          }
          new = new->next;
        } while (new != (object *)0x0);
      }
      list[uVar5] = orig;
      uVar7 = (ulong)(((int)uVar7 + 1) - (uint)(orig == (object *)0x0));
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)n);
  }
  return;
}

Assistant:

void store_stock_list(struct store *store, struct object **list, int n)
{
	bool not_home = store_is_home(store) ? false : true;
	int list_num;
	int num = 0;

	for (list_num = 0; list_num < n; list_num++) {
		struct object *current, *first = NULL;
		for (current = store->stock; current; current = current->next) {
			int i;
			bool possible = true;

			/* Skip objects already allocated */
			for (i = 0; i < num; i++)
				if (list[i] == current)
					possible = false;

			/* If still possible, choose the first in order */
			if (!possible)
				continue;
			else if (earlier_object(first, current, not_home))
				first = current;
		}

		/* Allocate and count the stock */
		list[list_num] = first;
		if (first)
			num++;
	}
}